

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  uint_least8_t *puVar1;
  char cVar2;
  basic_format_specs<wchar_t> *pbVar3;
  bool bVar4;
  type tVar5;
  wchar_t wVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  alignment aVar9;
  uint uVar10;
  wchar_t *pwVar11;
  wchar_t *local_38;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  local_30;
  
  if (begin == end) {
    return begin;
  }
  wVar6 = *begin;
  if (wVar6 == L'}') {
    return begin;
  }
  pwVar7 = begin + 1;
  uVar8 = (ulong)(pwVar7 != end);
  do {
    cVar2 = (char)begin[uVar8];
    if ('=' < cVar2) {
      if (cVar2 == '^') {
        aVar9 = ALIGN_CENTER;
      }
      else {
        if (cVar2 != '>') goto LAB_001ab369;
        aVar9 = ALIGN_RIGHT;
      }
LAB_001ab393:
      bVar4 = false;
LAB_001ab395:
      if ((int)uVar8 != 0) {
        if (wVar6 == L'{') {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     ).context_,"invalid fill character \'{\'");
          break;
        }
        pwVar7 = begin + 2;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ).super_specs_setter<wchar_t>.specs_)->super_align_spec).fill_ = wVar6;
      }
      if ((bVar4) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_)->super_align_spec).align_ = aVar9;
      begin = pwVar7;
      break;
    }
    if (cVar2 == '<') {
      aVar9 = ALIGN_LEFT;
      goto LAB_001ab393;
    }
    if (cVar2 == '=') {
      aVar9 = ALIGN_NUMERIC;
      bVar4 = true;
      goto LAB_001ab395;
    }
LAB_001ab369:
    bVar4 = 0 < (long)uVar8;
    uVar8 = uVar8 - 1;
  } while (bVar4);
  if (begin == end) {
    return begin;
  }
  cVar2 = (char)*begin;
  local_38 = begin;
  if (cVar2 == ' ') {
    tVar5 = handler->arg_type_;
    uVar10 = tVar5 - named_arg_type;
    if (8 < uVar10) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
      tVar5 = handler->arg_type_;
      uVar10 = tVar5 - named_arg_type;
    }
    if ((uVar10 < 7) && ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_001ab4f7:
    begin = begin + 1;
  }
  else {
    if (cVar2 == '-') {
      tVar5 = handler->arg_type_;
      uVar10 = tVar5 - named_arg_type;
      if (8 < uVar10) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
        tVar5 = handler->arg_type_;
        uVar10 = tVar5 - named_arg_type;
      }
      if ((uVar10 < 7) && ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_001ab4f7;
    }
    if (cVar2 == '+') {
      tVar5 = handler->arg_type_;
      uVar10 = tVar5 - named_arg_type;
      if (8 < uVar10) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
        tVar5 = handler->arg_type_;
        uVar10 = tVar5 - named_arg_type;
      }
      if ((uVar10 < 7) && ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_001ab4f7;
    }
  }
  if (begin == end) {
    return begin;
  }
  wVar6 = *begin;
  local_38 = begin;
  if (wVar6 == L'#') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 8;
    local_38 = begin + 1;
    if (local_38 == end) {
      return local_38;
    }
    wVar6 = *local_38;
  }
  pwVar7 = local_38;
  if (wVar6 == L'0') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar3 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             ).super_specs_setter<wchar_t>.specs_;
    (pbVar3->super_align_spec).fill_ = L'0';
    (pbVar3->super_align_spec).align_ = ALIGN_NUMERIC;
    local_38 = pwVar7 + 1;
    if (local_38 == end) {
      return local_38;
    }
    wVar6 = *local_38;
  }
  if ((uint)(wVar6 + L'\xffffffd0') < 10) {
    pwVar7 = local_38 + 1;
    uVar10 = 0;
    pwVar11 = pwVar7;
    if (wVar6 != L'0') {
      do {
        pwVar7 = pwVar11;
        if (0xccccccc < uVar10) {
          pwVar7 = pwVar7 + -1;
          uVar10 = 0x80000000;
          goto LAB_001ab62e;
        }
        uVar10 = (wVar6 + uVar10 * 10) - 0x30;
        if (pwVar7 == end) break;
        wVar6 = *pwVar7;
        pwVar11 = pwVar7 + 1;
      } while ((uint)(wVar6 + L'\xffffffd0') < 10);
      if ((int)uVar10 < 0) {
LAB_001ab62e:
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_align_spec).width_ = uVar10;
LAB_001ab644:
    local_38 = pwVar7;
    if (pwVar7 == end) {
      return pwVar7;
    }
  }
  else if (wVar6 == L'{') {
    pwVar7 = local_38 + 1;
    if (pwVar7 != end) {
      local_30.handler = handler;
      pwVar7 = parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                         (pwVar7,end,&local_30);
    }
    if ((pwVar7 == end) || (*pwVar7 != L'}')) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"invalid format string");
    }
    else {
      pwVar7 = pwVar7 + 1;
    }
    goto LAB_001ab644;
  }
  if (*local_38 == L'.') {
    pwVar7 = local_38 + 1;
    if (pwVar7 == end) {
LAB_001ab729:
      local_38 = pwVar7;
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"missing precision specifier");
      return pwVar7;
    }
    if ((uint)(*pwVar7 + L'\xffffffd0') < 10) {
      local_38 = pwVar7;
      uVar10 = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                         (&local_38,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).precision = uVar10;
    }
    else {
      if (*pwVar7 != L'{') goto LAB_001ab729;
      pwVar7 = local_38 + 2;
      local_38 = pwVar7;
      if (pwVar7 != end) {
        local_30.handler = handler;
        pwVar7 = parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                           (pwVar7,end,
                            (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                             *)&local_30);
      }
      pwVar11 = pwVar7;
      if ((pwVar7 == end) || (pwVar11 = pwVar7 + 1, local_38 = pwVar11, *pwVar7 != L'}')) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ).context_,"invalid format string");
        return pwVar11;
      }
    }
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ).context_,"precision not allowed for this argument type");
    }
  }
  if ((local_38 != end) && (wVar6 = *local_38, wVar6 != L'}')) {
    local_38 = local_38 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).type = (char)wVar6;
  }
  return local_38;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}